

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O3

scm_type __thiscall
skiwi::make_list(skiwi *this,vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_> *lst)

{
  pointer psVar1;
  pointer psVar2;
  ulong uVar3;
  scm_type local_58;
  scm_type local_50;
  scm_type local_48;
  scm_type local_40;
  scm_type local_38;
  
  psVar1 = (lst->super__Vector_base<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (lst->super__Vector_base<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar1 == psVar2) {
    scm_type::scm_type((scm_type *)this,0x1f);
  }
  else {
    local_58.scm_value = psVar2[-1].scm_value;
    scm_type::scm_type(&local_40,0x1f);
    uVar3 = (ulong)DAT_002a7ef0 | 5;
    *DAT_002a7ef0 = 0x500000000000002;
    DAT_002a7ef0[1] = local_58.scm_value;
    DAT_002a7ef0[2] = local_40.scm_value;
    DAT_002a7ef0 = DAT_002a7ef0 + 3;
    scm_type::scm_type((scm_type *)this,uVar3);
    psVar2 = psVar2 + -1;
    scm_type::~scm_type(&local_40);
    scm_type::~scm_type(&local_58);
    if (psVar2 != psVar1) {
      do {
        local_48.scm_value = psVar2[-1].scm_value;
        local_50.scm_value = *(uint64_t *)this;
        uVar3 = (ulong)DAT_002a7ef0 | 5;
        *DAT_002a7ef0 = 0x500000000000002;
        DAT_002a7ef0[1] = local_48.scm_value;
        DAT_002a7ef0[2] = local_50.scm_value;
        DAT_002a7ef0 = DAT_002a7ef0 + 3;
        scm_type::scm_type(&local_38,uVar3);
        psVar2 = psVar2 + -1;
        *(uint64_t *)this = local_38.scm_value;
        scm_type::~scm_type(&local_38);
        scm_type::~scm_type(&local_50);
        scm_type::~scm_type(&local_48);
      } while (psVar2 != psVar1);
    }
  }
  return (scm_type)(uint64_t)this;
}

Assistant:

scm_type make_list(const std::vector<scm_type>& lst)
  {
  if (lst.empty())
    return make_nil();
  auto it = lst.rbegin();
  auto it_end = lst.rend();
  scm_type out = make_pair(*it, make_nil());
  ++it;
  while (it != it_end)
    {
    out = make_pair(*it, out);
    ++it;
    }
  return out;
  }